

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

QString * __thiscall
QTextEdit::anchorAt(QString *__return_storage_ptr__,QTextEdit *this,QPoint *pos)

{
  long lVar1;
  QTextEditPrivate *this_00;
  QWidgetTextControl *pQVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pQVar2 = this_00->control;
  QTextEditPrivate::mapToContents(this_00,pos);
  (**(code **)(*(long *)pQVar2 + 0x70))(__return_storage_ptr__,pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextEdit::anchorAt(const QPoint& pos) const
{
    Q_D(const QTextEdit);
    return d->control->anchorAt(d->mapToContents(pos));
}